

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O0

void __thiscall BlockCondition::scopeBreak(BlockCondition *this,int4 curexit,int4 curloopexit)

{
  FlowBlock *pFVar1;
  int4 curloopexit_local;
  int4 curexit_local;
  BlockCondition *this_local;
  
  pFVar1 = BlockGraph::getBlock(&this->super_BlockGraph,0);
  (*pFVar1->_vptr_FlowBlock[8])(pFVar1,0xffffffff,(ulong)(uint)curloopexit);
  pFVar1 = BlockGraph::getBlock(&this->super_BlockGraph,1);
  (*pFVar1->_vptr_FlowBlock[8])(pFVar1,0xffffffff,(ulong)(uint)curloopexit);
  return;
}

Assistant:

void BlockCondition::scopeBreak(int4 curexit,int4 curloopexit)

{
  getBlock(0)->scopeBreak(-1,curloopexit); // No fixed exit
  getBlock(1)->scopeBreak(-1,curloopexit);
}